

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double nifti_cdf2stat(double p,int code,double p1,double p2,double p3)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  pqpair pq;
  pqpair pq_00;
  pqpair pq_01;
  pqpair pq_02;
  pqpair pq_03;
  pqpair pq_04;
  pqpair pq_05;
  pqpair pVar7;
  double p_1;
  double q;
  int status;
  double local_a0;
  double local_98;
  double bound;
  double local_80;
  int which;
  undefined4 uStack_74;
  double df;
  double x;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double ompr;
  int status_3;
  double local_30;
  
  pVar7.q = 1.0 - p;
  if ((((1.0 < pVar7.q) || (1.0 < p)) || (x = 0.0, p < 0.0)) || (pVar7.q < 0.0))
  goto switchD_0010f88e_default;
  local_98 = p2;
  p_1 = p;
  local_a0 = p;
  df = p1;
  local_60 = pVar7.q;
  switch(code) {
  case 2:
    pVar7.p = p;
    dVar6 = beta_pq2s(pVar7,p1 * 0.5,p1 * 0.5);
    x = dVar6 + dVar6 + -1.0;
    break;
  case 3:
    pq_03.q = pVar7.q;
    pq_03.p = p;
    dVar6 = student_pq2s(pq_03,p1);
    return dVar6;
  case 4:
    _which = (double)CONCAT44(uStack_74,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar7.q) {
      x = 0.0;
      q = pVar7.q;
      bound = p2;
      cdff(&which,&p_1,&q,&x,&df,&bound,&status,&ompr);
      return x;
    }
    goto LAB_001100f5;
  case 5:
    pq_02.q = pVar7.q;
    pq_02.p = p;
    dVar6 = normal_pq2s(pq_02);
    return dVar6;
  case 6:
    pq.q = pVar7.q;
    pq.p = p;
    dVar6 = chisq_pq2s(pq,p1);
    return dVar6;
  case 7:
    pq_05.q = pVar7.q;
    pq_05.p = p;
    dVar6 = beta_pq2s(pq_05,p1,p2);
    return dVar6;
  case 8:
    status = 2;
    x = 0.0;
    ompr = 1.0 - p2;
    q = pVar7.q;
    bound = p2;
    cdfbin(&status,&p_1,&q,&x,&df,&bound,&ompr,&status_3,(double *)&which);
    break;
  case 9:
    _which = (double)CONCAT44(uStack_74,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar7.q) {
      x = 0.0;
      q = pVar7.q;
      bound = p2;
      cdfgam(&which,&p_1,&q,&x,&df,&bound,&status,&ompr);
      return x;
    }
    goto LAB_001100f5;
  case 10:
    ompr = (double)CONCAT44(ompr._4_4_,2);
    x = 0.0;
    q = pVar7.q;
    cdfpoi((int *)&ompr,&p_1,&q,&x,&df,&which,&bound);
    break;
  case 0xb:
    x = 9.99e+37;
    if (0.0 < p2) {
      pq_00.q = pVar7.q;
      pq_00.p = p;
      dVar6 = normal_pq2s(pq_00);
      x = dVar6 * local_98 + p1;
    }
    break;
  case 0xc:
    status = 2;
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar7.q) {
      x = 0.0;
      q = pVar7.q;
      bound = p2;
      _which = p3;
      cdffnc(&status,&p_1,&q,&x,&df,&bound,(double *)&which,&status_3,&ompr);
      return x;
    }
    goto LAB_001100f5;
  case 0xd:
    _which = (double)CONCAT44(uStack_74,2);
    if (p <= 0.0) {
      return 0.0;
    }
    if (0.0 < pVar7.q) {
      x = 0.0;
      ompr = p2;
      cdfchn(&which,&p_1,&q,&x,&df,&ompr,&status,&bound);
      return x;
    }
LAB_001100f5:
    x = 9.99e+37;
    break;
  case 0xe:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    if (p <= 0.0) {
LAB_0010ffe4:
      uVar3 = 0x91b9efde;
      uVar5 = 0xc7d2ca02;
    }
    else if (0.0 < pVar7.q) {
      if (p < pVar7.q) {
        dVar6 = 1.0 / p + -1.0;
        goto LAB_0011004c;
      }
      dVar6 = 1.0 / pVar7.q + -1.0;
LAB_0011003d:
      dVar6 = log(dVar6);
      uVar3 = SUB84(dVar6,0);
      uVar5 = (uint)((ulong)dVar6 >> 0x20);
    }
    else {
LAB_0010fff7:
      uVar3 = 0x91b9efde;
      uVar5 = 0x47d2ca02;
    }
    goto LAB_00110066;
  case 0xf:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    if (p <= 0.0) goto LAB_0010ffe4;
    if (pVar7.q <= 0.0) goto LAB_0010fff7;
    if (p < pVar7.q) {
      dVar6 = p + p;
      goto LAB_0011003d;
    }
    dVar6 = pVar7.q + pVar7.q;
LAB_0011004c:
    dVar6 = log(dVar6);
    uVar5 = (uint)((ulong)dVar6 >> 0x20) ^ 0x80000000;
    uVar3 = SUB84(dVar6,0);
    goto LAB_00110066;
  case 0x10:
    if (p2 <= p1) {
      return 9.99e+37;
    }
    local_98 = (p2 - p1) * p;
    goto LAB_0011006a;
  case 0x11:
    if (0.0 < p1) {
      if (p <= 0.0) {
        return -9.99e+37;
      }
      if (0.0 < pVar7.q) {
        pq_01.q = pVar7.q;
        pq_01.p = p;
        local_58 = student_pq2s(pq_01,p1);
        if (ABS(local_98) < 1e-08) {
          return local_58;
        }
        uStack_50 = 0;
        local_58 = local_98 * 0.5 + local_58;
        local_80 = 1.0;
        if (1.0 <= ABS(local_58) * 0.1) {
          local_80 = ABS(local_58) * 0.1;
        }
        iVar1 = 1000;
        while( true ) {
          bVar2 = iVar1 == 0;
          iVar1 = iVar1 + -1;
          if (bVar2) {
            return -9.99e+37;
          }
          pVar7 = tnonc_s2pq(local_58,p1,local_98);
          if (pVar7.p <= local_a0) break;
          local_58 = local_58 - local_80;
        }
        local_30 = local_80 * 0.5 + local_58;
        iVar1 = 1000;
        while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
          pVar7 = tnonc_s2pq(local_30,p1,local_98);
          if (local_a0 <= pVar7.p) {
            p_1 = (local_58 + local_30) * 0.5;
            E0000::small = local_58;
            E0000::big = local_30;
            E0000::absstp = 0.5;
            E0000::relstp = 0.5;
            E0000::stpmul = 5.0;
            E0000::abstol = 1e-50;
            E0000::reltol = 1e-08;
            bound = (double)((ulong)bound & 0xffffffff00000000);
            local_58 = (double)-(ulong)(local_60 < local_a0);
            uStack_50 = 0;
            while( true ) {
              dinvr((int *)&bound,&p_1,&q,(unsigned_long *)&df,(unsigned_long *)&x);
              if (bound._0_4_ != 1) break;
              pVar7 = tnonc_s2pq(p_1,p1,local_98);
              q = (double)(~(ulong)local_58 & (ulong)(local_a0 - pVar7.p) |
                          (ulong)(local_60 - pVar7.q) & (ulong)local_58);
            }
            return p_1;
          }
          local_30 = local_30 + local_80;
        }
        goto LAB_001100f5;
      }
    }
    x = 9.99e+37;
    break;
  case 0x12:
    if (p2 <= 0.0) goto switchD_0010f88e_default;
    if (p3 <= 0.0) {
      return 9.99e+37;
    }
    uVar3 = 0;
    uVar5 = 0;
    if ((0.0 < p) && (0.0 < p3)) {
      if (pVar7.q <= 0.0) goto LAB_0010fff7;
      local_a0 = p3;
      dVar6 = log(pVar7.q);
      dVar6 = pow(-dVar6,1.0 / local_a0);
      uVar3 = SUB84(dVar6,0);
      uVar5 = (uint)((ulong)dVar6 >> 0x20);
    }
    goto LAB_00110066;
  case 0x13:
    if ((0.0 < p) && (x = 9.99e+37, 0.0 < pVar7.q)) {
      pq_04.q = pVar7.q;
      pq_04.p = p;
      dVar6 = chisq_pq2s(pq_04,p1);
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
        return dVar6;
      }
      x = SQRT(dVar6);
    }
    break;
  case 0x14:
    if (0.0 < p1) {
      if (p2 <= 0.0) {
        return 9.99e+37;
      }
      local_98 = p2 / p1;
      uVar3 = 0x91b9efde;
      uVar4 = 0x47d2ca02;
      if ((0.0 < local_98) && (uVar3 = 0, uVar4 = 0, 0.0 < p)) {
        if (0.0 < pVar7.q) {
          local_58 = 1.01;
          iVar1 = 1000;
          while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
            pVar7 = invgauss_s2pq(local_58,local_98);
            if (pVar7.p <= local_a0) {
              iVar1 = 0x3e9;
              local_80 = local_58;
              goto LAB_0011011b;
            }
            local_58 = local_58 * 0.9;
          }
          uVar3 = 0;
          uVar4 = 0;
        }
        else {
          uVar3 = 0x91b9efde;
          uVar4 = 0x47d2ca02;
        }
      }
      goto LAB_0011000e;
    }
  default:
switchD_0010f88e_default:
    x = 9.99e+37;
    break;
  case 0x15:
    if (p2 <= 0.0) {
      return 9.99e+37;
    }
    if (p <= 0.0) goto LAB_0010ffe4;
    if (1.0 <= p) goto LAB_0010fff7;
    dVar6 = log(p);
    dVar6 = log(-dVar6);
    uVar5 = (uint)((ulong)dVar6 >> 0x20) ^ 0x80000000;
    uVar3 = SUB84(dVar6,0);
LAB_00110066:
    local_98 = local_98 * (double)CONCAT44(uVar5,uVar3);
LAB_0011006a:
    x = local_98 + p1;
    break;
  case 0x16:
    x = pVar7.q;
    break;
  case 0x17:
    if (pVar7.q <= 0.0) {
      return 9.99e+37;
    }
    dVar6 = log(pVar7.q);
    uVar3 = SUB84(dVar6,0);
    uVar4 = (undefined4)((ulong)dVar6 >> 0x20);
    goto LAB_0010ff78;
  case 0x18:
    if (pVar7.q <= 0.0) {
      return 9.99e+37;
    }
    dVar6 = log10(pVar7.q);
    uVar3 = SUB84(dVar6,0);
    uVar4 = (undefined4)((ulong)dVar6 >> 0x20);
LAB_0010ff78:
    x = -(double)CONCAT44(uVar4,uVar3);
  }
  return x;
  while( true ) {
    local_80 = local_80 * 1.1;
    pVar7 = invgauss_s2pq(local_80,local_98);
    uVar3 = SUB84(local_a0,0);
    uVar4 = (undefined4)((ulong)local_a0 >> 0x20);
    if (local_a0 <= pVar7.p) break;
LAB_0011011b:
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      uVar3 = 0x91b9efde;
      uVar4 = 0x47d2ca02;
      goto LAB_0011000e;
    }
  }
  dVar6 = local_58 * local_80;
  if (dVar6 < 0.0) {
    p_1 = sqrt(dVar6);
    uVar3 = SUB84(local_a0,0);
    uVar4 = (undefined4)((ulong)local_a0 >> 0x20);
  }
  else {
    p_1 = SQRT(dVar6);
  }
  E0000::small = local_58;
  E0000::big = local_80;
  E0000::absstp = 0.5;
  E0000::relstp = 0.5;
  E0000::stpmul = 5.0;
  E0000::abstol = 1e-50;
  E0000::reltol = 1e-08;
  bound = (double)((ulong)bound._4_4_ << 0x20);
  local_58 = (double)-(ulong)(local_60 < (double)CONCAT44(uVar4,uVar3));
  uStack_50 = 0;
  while( true ) {
    dinvr((int *)&bound,&p_1,&q,(unsigned_long *)&df,(unsigned_long *)&x);
    uVar3 = SUB84(p_1,0);
    uVar4 = (undefined4)((ulong)p_1 >> 0x20);
    if (bound._0_4_ != 1) break;
    pVar7 = invgauss_s2pq(p_1,local_98);
    q = (double)(~(ulong)local_58 & (ulong)(local_a0 - pVar7.p) |
                (ulong)(local_60 - pVar7.q) & (ulong)local_58);
  }
LAB_0011000e:
  return (double)CONCAT44(uVar4,uVar3) * p1;
}

Assistant:

double nifti_cdf2stat( double p , int code, double p1,double p2,double p3 )
{
   pqpair pq ;
   pq.p = p ; pq.q = 1.0-p ;
   return pq2stat(pq,code,p1,p2,p3) ;
}